

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_in_parallel_(void)

{
  int iVar1;
  kmp_info_t *pkVar2;
  kmp_info_t *th;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pkVar2 = __kmp_entry_thread();
  if ((pkVar2->th).th_teams_microtask == (microtask_t)0x0) {
    iVar1 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else {
    iVar1 = (((pkVar2->th).th_team)->t).t_active_level;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_IN_PARALLEL)(void) {
#ifdef KMP_STUB
  return 0;
#else
  kmp_info_t *th = __kmp_entry_thread();
  if (th->th.th_teams_microtask) {
    // AC: r_in_parallel does not work inside teams construct where real
    // parallel is inactive, but all threads have same root, so setting it in
    // one team affects other teams.
    // The solution is to use per-team nesting level
    return (th->th.th_team->t.t_active_level ? 1 : 0);
  } else
    return (th->th.th_root->r.r_in_parallel ? FTN_TRUE : FTN_FALSE);
#endif
}